

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  Vec_Int_t *pVVar1;
  long *plVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  Vec_Str_t *pVVar9;
  char *__s;
  word *pwVar10;
  word wVar11;
  long lVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  Sfm_Ntk_t *pSVar15;
  int iVar16;
  int iVar17;
  size_t __n;
  long lVar18;
  int nTotal;
  Vec_Int_t *pVStack_20078;
  Vec_Wrd_t *pVStack_20070;
  long lStack_20068;
  Vec_Wrd_t *pVStack_20060;
  Vec_Str_t *pVStack_20058;
  Vec_Wec_t *pVStack_20050;
  void **ppvStack_20048;
  word *pwStack_20040;
  word TruthStore [16] [1024];
  
  pVVar8 = (Vec_Int_t *)0x0;
  memset(TruthStore,0,0x20000);
  nTotal = 0;
  pVVar6 = Abc_NtkAssignIDs2(pNtk);
  lStack_20068 = (long)pVVar6->nSize;
  __n = (long)pNtk->vCos->nSize + pNtk->vCis->nSize + lStack_20068;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  uVar4 = (uint)__n;
  uVar5 = 8;
  if (6 < uVar4 - 1) {
    uVar5 = uVar4;
  }
  pVVar7->nCap = uVar5;
  if (uVar5 != 0) {
    pVVar8 = (Vec_Int_t *)calloc((long)(int)uVar5,0x10);
  }
  pVVar7->pArray = pVVar8;
  pVVar7->nSize = uVar4;
  pVVar9 = (Vec_Str_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar5 = uVar4;
  }
  pVVar9->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)(int)uVar5);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = uVar4;
  memset(__s,0,__n);
  pVStack_20070 = (Vec_Wrd_t *)malloc(0x10);
  pVStack_20070->nCap = uVar5;
  if (uVar5 == 0) {
    pwStack_20040 = (word *)0x0;
  }
  else {
    pwStack_20040 = (word *)malloc((long)(int)uVar5 << 3);
  }
  pVStack_20070->pArray = pwStack_20040;
  pVStack_20070->nSize = uVar4;
  memset(pwStack_20040,0,__n * 8);
  pVStack_20078 = Abc_NtkAssignStarts(pNtk,pVVar6,&nTotal);
  iVar17 = nTotal;
  pVStack_20060 = (Vec_Wrd_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar16 = iVar17;
  }
  pVStack_20060->nSize = 0;
  pVStack_20060->nCap = iVar16;
  pVStack_20050 = pVVar7;
  if (iVar16 == 0) {
    pwVar10 = (word *)0x0;
  }
  else {
    pwVar10 = (word *)malloc((long)iVar16 << 3);
  }
  pVStack_20060->pArray = pwVar10;
  pVStack_20058 = pVVar9;
  Abc_NtkFillTruthStore(TruthStore);
  if (0 < (int)lStack_20068) {
    ppvStack_20048 = pVVar6->pArray;
    lVar18 = 0;
    do {
      plVar2 = (long *)ppvStack_20048[lVar18];
      if (6 < *(int *)((long)plVar2 + 0x1c)) {
        if ((-1 < (int)plVar2[8]) && ((int)plVar2[8] < pVStack_20078->nSize)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      wVar11 = Abc_SopToTruth((char *)plVar2[7],*(int *)((long)plVar2 + 0x1c));
      iVar17 = (int)plVar2[8];
      if (((long)iVar17 < 0) || ((int)uVar4 <= iVar17)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      pwStack_20040[iVar17] = wVar11;
      if (wVar11 - 1 < 0xfffffffffffffffe) {
        lVar12 = (long)(int)*(uint *)(plVar2 + 8);
        if ((lVar12 < 0) || (uVar4 <= *(uint *)(plVar2 + 8))) goto LAB_002e1a22;
        pVVar1 = pVVar8 + lVar12;
        iVar17 = *(int *)((long)plVar2 + 0x1c);
        if (pVVar8[lVar12].nCap < iVar17) {
          if (pVVar1->pArray == (int *)0x0) {
            piVar13 = (int *)malloc((long)iVar17 << 2);
          }
          else {
            piVar13 = (int *)realloc(pVVar1->pArray,(long)iVar17 << 2);
          }
          pVVar1->pArray = piVar13;
          if (piVar13 == (int *)0x0) goto LAB_002e1ab1;
          pVVar1->nCap = iVar17;
          iVar17 = *(int *)((long)plVar2 + 0x1c);
        }
        if (0 < iVar17) {
          lVar12 = 0;
          do {
            Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                 (long)*(int *)(plVar2[4] + lVar12 * 4) * 8) + 0x40)
                       );
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar2 + 0x1c));
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lStack_20068);
  }
  pVVar14 = pNtk->vCos;
  if (0 < pVVar14->nSize) {
    lVar18 = 0;
    do {
      plVar2 = (long *)pVVar14->pArray[lVar18];
      lVar12 = (long)(int)plVar2[8];
      if ((lVar12 < 0) || ((int)uVar4 <= (int)plVar2[8])) {
LAB_002e1a22:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar1 = pVVar8 + lVar12;
      iVar17 = *(int *)((long)plVar2 + 0x1c);
      if (pVVar8[lVar12].nCap < iVar17) {
        if (pVVar1->pArray == (int *)0x0) {
          piVar13 = (int *)malloc((long)iVar17 << 2);
        }
        else {
          piVar13 = (int *)realloc(pVVar1->pArray,(long)iVar17 << 2);
        }
        pVVar1->pArray = piVar13;
        if (piVar13 == (int *)0x0) {
LAB_002e1ab1:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = iVar17;
        iVar17 = *(int *)((long)plVar2 + 0x1c);
      }
      if (0 < iVar17) {
        lVar12 = 0;
        do {
          Vec_IntPush(pVVar1,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                               (long)*(int *)(plVar2[4] + lVar12 * 4) * 8) + 0x40));
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar18 = lVar18 + 1;
      pVVar14 = pNtk->vCos;
    } while (lVar18 < pVVar14->nSize);
  }
  pVVar7 = pVStack_20050;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar18 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar18];
      if (((pvVar3 != (void *)0x0) && (iPivot <= lVar18)) &&
         ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar17 = *(int *)((long)pvVar3 + 0x40);
        if (((long)iVar17 < 0) || (pVStack_20058->nSize <= iVar17)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        pVStack_20058->pArray[iVar17] = '\x01';
        pVVar6 = pNtk->vObjs;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar6->nSize);
  }
  pSVar15 = Sfm_NtkConstruct(pVVar7,pNtk->vCis->nSize,pNtk->vCos->nSize,pVStack_20058,
                             (Vec_Str_t *)0x0,pVStack_20070,pVStack_20078,pVStack_20060);
  return pSVar15;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdAlloc( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}